

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O3

void __thiscall
TPZEulerAnalysis::CFLControl
          (TPZEulerAnalysis *this,REAL *lastEpsilon,REAL *epsilon,REAL *epsilon_Newton,
          REAL *timeStep)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (((0.0 < *lastEpsilon) && (0.0 < *epsilon)) && (0 < this->fEvolCFL)) {
    TPZFlowCompMesh::ScaleCFL(this->fFlowCompMesh,*lastEpsilon / *epsilon);
    *timeStep = (*lastEpsilon / *epsilon) * *timeStep;
  }
  dVar2 = *epsilon_Newton;
  dVar3 = this->fNewtonEps;
  iVar1 = this->fEvolCFL;
  if (1 < iVar1 && dVar2 < dVar3) {
    TPZFlowCompMesh::ScaleCFL(this->fFlowCompMesh,2.0);
    *timeStep = *timeStep + *timeStep;
    dVar2 = *epsilon_Newton;
    dVar3 = this->fNewtonEps;
    iVar1 = this->fEvolCFL;
  }
  if ((dVar3 < dVar2) && (2 < iVar1)) {
    TPZFlowCompMesh::ScaleCFL(this->fFlowCompMesh,0.5);
    *timeStep = *timeStep * 0.5;
  }
  *lastEpsilon = *epsilon;
  return;
}

Assistant:

void TPZEulerAnalysis::CFLControl(REAL & lastEpsilon, REAL & epsilon, REAL & epsilon_Newton, REAL & timeStep)
{
	// CFL control based on Flux reduction
	if((lastEpsilon>0. && epsilon>0.) && fEvolCFL >= 1)
	{
		fFlowCompMesh->ScaleCFL(lastEpsilon/epsilon);
		timeStep *= lastEpsilon/epsilon;
	}
	
	// CFL control based on Nonlinear invertion
	if(epsilon_Newton < fNewtonEps && fEvolCFL >= 2)
	{
		fFlowCompMesh->ScaleCFL(2.);
		timeStep *= 2.;
	}
	
	if(epsilon_Newton > fNewtonEps && fEvolCFL >= 3)
	{
		fFlowCompMesh->ScaleCFL(.5);
		timeStep *= .5;
	}
	
	lastEpsilon = epsilon;
}